

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O2

line_data_t *
kiste::parse_text_line(line_data_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  char *pcVar1;
  size_t sVar2;
  parse_error *this;
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  
  if (ctx->_class_curly_level < ctx->_curly_level) {
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = (pointer)0x0;
    local_48._M_p = (pointer)0x0;
    line_data_t::line_data_t
              (__return_storage_ptr__,text,
               (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_58);
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
              ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_58);
    for (sVar2 = 0; sVar2 < line->_M_string_length; sVar2 = sVar2 + 1) {
      pcVar1 = (char *)std::__cxx11::string::at((ulong)line);
      if (*pcVar1 == '$') {
        parse_command((segment_t *)local_58,line,sVar2 + 1);
        sVar2 = line_data_t::add_segment(__return_storage_ptr__,(segment_t *)local_58);
        std::__cxx11::string::~string((string *)&local_48);
      }
      else {
        pcVar1 = (char *)std::__cxx11::string::at((ulong)line);
        line_data_t::add_character(__return_storage_ptr__,*pcVar1);
      }
    }
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  parse_error::parse_error(this,"Unexpected text outside of member function");
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_text_line(const parse_context& ctx, const std::string& line) -> line_data_t
  {
    if (ctx._curly_level <= ctx._class_curly_level)
      throw parse_error("Unexpected text outside of member function");

    auto text_line = line_data_t{line_type::text, {}};
    for (std::size_t pos = 0; pos < line.size(); ++pos)
    {
      switch (line.at(pos))
      {
      case '$':
      {
        pos = text_line.add_segment(parse_command(line, ++pos));
        break;
      }
      default:
        text_line.add_character(line.at(pos));
        break;
      }
    }

    return text_line;
  }